

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O0

double maxerror(float *A,float *B,int n)

{
  double local_38;
  double diff;
  double error;
  int local_20;
  int j;
  int i;
  int n_local;
  float *B_local;
  float *A_local;
  
  diff = 0.0;
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    for (error._4_4_ = 0; error._4_4_ < n; error._4_4_ = error._4_4_ + 1) {
      local_38 = (double)((A[local_20 * n + error._4_4_] - B[local_20 * n + error._4_4_]) /
                         A[local_20 * n + error._4_4_]);
      if (local_38 < 0.0) {
        local_38 = -local_38;
      }
      if (diff < local_38) {
        diff = local_38;
      }
    }
  }
  return diff;
}

Assistant:

double maxerror(REAL *A, REAL *B, int n)
{
    int i, j;
    double error = 0.0;

    for (i = 0; i < n; i++) {
        for (j = 0; j < n; j++) {
            double diff = (A[i * n + j] - B[i * n + j]) / A[i * n + j];
            if (diff < 0)
                diff = -diff;
            if (diff > error)
                error = diff;
        }
    }
    return error;
}